

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.cpp
# Opt level: O3

void amrex::BaseFab_Initialize(void)

{
  PTR_TO_VOID_FUNC unaff_retaddr;
  
  if ((anonymous_namespace)::basefab_initialized == '\0') {
    (anonymous_namespace)::basefab_initialized = '\x01';
  }
  ExecOnFinalize(unaff_retaddr);
  return;
}

Assistant:

void
BaseFab_Initialize ()
{
    if (!basefab_initialized)
    {
        basefab_initialized = true;

#ifdef AMREX_USE_OMP
#pragma omp parallel
        {
            amrex::private_total_bytes_allocated_in_fabs     = 0;
            amrex::private_total_bytes_allocated_in_fabs_hwm = 0;
            amrex::private_total_cells_allocated_in_fabs     = 0;
            amrex::private_total_cells_allocated_in_fabs_hwm = 0;
        }
#endif

#ifdef AMREX_MEM_PROFILING
        MemProfiler::add("Fab", std::function<MemProfiler::MemInfo()>
                         ([] () -> MemProfiler::MemInfo {
                             return {amrex::TotalBytesAllocatedInFabs(),
                                     amrex::TotalBytesAllocatedInFabsHWM()};
                         }));
#endif
    }

    amrex::ExecOnFinalize(amrex::BaseFab_Finalize);
}